

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O0

S1Interval __thiscall S1Interval::Expanded(S1Interval *this,double margin)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  S1Interval SVar4;
  double margin_local;
  S1Interval *this_local;
  S1Interval result;
  
  if (margin < 0.0) {
    bVar1 = is_full(this);
    if (bVar1) {
      return (S1Interval)(Vector2_d)*&(this->bounds_).c_;
    }
    dVar2 = GetLength(this);
    if ((dVar2 + margin * 2.0) - 4.440892098500626e-16 <= 0.0) {
      SVar4 = Empty();
      return (Vector2_d)SVar4.bounds_.c_;
    }
  }
  else {
    bVar1 = is_empty(this);
    if (bVar1) {
      return (S1Interval)(Vector2_d)*&(this->bounds_).c_;
    }
    dVar2 = GetLength(this);
    if (6.283185307179586 <= dVar2 + margin * 2.0 + 4.440892098500626e-16) {
      SVar4 = Full();
      return (Vector2_d)SVar4.bounds_.c_;
    }
  }
  dVar2 = lo(this);
  dVar2 = remainder(dVar2 - margin,6.283185307179586);
  dVar3 = hi(this);
  dVar3 = remainder(dVar3 + margin,6.283185307179586);
  S1Interval((S1Interval *)&this_local,dVar2,dVar3);
  dVar2 = lo((S1Interval *)&this_local);
  if (dVar2 <= -3.141592653589793) {
    set_lo((S1Interval *)&this_local,3.141592653589793);
  }
  return (Vector2_d)(Vector2_d)_this_local;
}

Assistant:

S1Interval S1Interval::Expanded(double margin) const {
  if (margin >= 0) {
    if (is_empty()) return *this;
    // Check whether this interval will be full after expansion, allowing
    // for a 1-bit rounding error when computing each endpoint.
    if (GetLength() + 2 * margin + 2 * DBL_EPSILON >= 2 * M_PI) return Full();
  } else {
    if (is_full()) return *this;
    // Check whether this interval will be empty after expansion, allowing
    // for a 1-bit rounding error when computing each endpoint.
    if (GetLength() + 2 * margin - 2 * DBL_EPSILON <= 0) return Empty();
  }
  S1Interval result(remainder(lo() - margin, 2*M_PI),
                    remainder(hi() + margin, 2*M_PI));
  if (result.lo() <= -M_PI) result.set_lo(M_PI);
  return result;
}